

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O2

_Bool av1_resize_plane(uint8_t *input,int height,int width,int in_stride,uint8_t *output,int height2
                      ,int width2,int out_stride)

{
  int iVar1;
  uint8_t *memblk;
  uint8_t *otmp;
  uint8_t *arr;
  uint8_t *output_00;
  uint8_t *puVar2;
  ulong uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  int local_60;
  char local_44;
  
  memblk = (uint8_t *)aom_malloc((long)width2 * (long)height);
  iVar1 = height;
  if (height < width) {
    iVar1 = width;
  }
  otmp = (uint8_t *)aom_malloc((long)iVar1);
  arr = (uint8_t *)aom_malloc((long)height);
  output_00 = (uint8_t *)aom_malloc((long)height2);
  local_60 = (int)otmp;
  auVar5._0_4_ = -(uint)((int)((ulong)memblk >> 0x20) == 0 && (int)memblk == 0);
  auVar5._4_4_ = -(uint)(local_60 == 0 && (int)((ulong)otmp >> 0x20) == 0);
  auVar5._8_4_ = -(uint)((int)((ulong)arr >> 0x20) == 0 && (int)arr == 0);
  auVar5._12_4_ = -(uint)((int)output_00 == 0 && (int)((ulong)output_00 >> 0x20) == 0);
  iVar1 = movmskps((int)output_00,auVar5);
  if (iVar1 == 0) {
    uVar3 = 0;
    puVar2 = memblk;
    if (0 < height) {
      uVar3 = (ulong)(uint)height;
    }
    while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
      resize_multistep(input,width,puVar2,width2,otmp);
      input = input + in_stride;
      puVar2 = puVar2 + width2;
    }
    uVar3 = 0;
    puVar2 = memblk;
    if (0 < width2) {
      uVar3 = (ulong)(uint)width2;
    }
    while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
      fill_col_to_arr(puVar2,width2,height,arr);
      resize_multistep(arr,height,output_00,height2,otmp);
      fill_arr_to_col(output,out_stride,height2,output_00);
      output = output + 1;
      puVar2 = puVar2 + 1;
    }
  }
  local_44 = (char)iVar1;
  aom_free(memblk);
  aom_free(otmp);
  aom_free(arr);
  aom_free(output_00);
  return local_44 == '\0';
}

Assistant:

bool av1_resize_plane(const uint8_t *input, int height, int width,
                      int in_stride, uint8_t *output, int height2, int width2,
                      int out_stride) {
  int i;
  bool mem_status = true;
  uint8_t *intbuf = (uint8_t *)aom_malloc(sizeof(uint8_t) * width2 * height);
  uint8_t *tmpbuf =
      (uint8_t *)aom_malloc(sizeof(uint8_t) * AOMMAX(width, height));
  uint8_t *arrbuf = (uint8_t *)aom_malloc(sizeof(uint8_t) * height);
  uint8_t *arrbuf2 = (uint8_t *)aom_malloc(sizeof(uint8_t) * height2);
  if (intbuf == NULL || tmpbuf == NULL || arrbuf == NULL || arrbuf2 == NULL) {
    mem_status = false;
    goto Error;
  }
  assert(width > 0);
  assert(height > 0);
  assert(width2 > 0);
  assert(height2 > 0);
  for (i = 0; i < height; ++i)
    resize_multistep(input + in_stride * i, width, intbuf + width2 * i, width2,
                     tmpbuf);
  for (i = 0; i < width2; ++i) {
    fill_col_to_arr(intbuf + i, width2, height, arrbuf);
    resize_multistep(arrbuf, height, arrbuf2, height2, tmpbuf);
    fill_arr_to_col(output + i, out_stride, height2, arrbuf2);
  }

Error:
  aom_free(intbuf);
  aom_free(tmpbuf);
  aom_free(arrbuf);
  aom_free(arrbuf2);
  return mem_status;
}